

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconengine.cpp
# Opt level: O3

void __thiscall QIconEngine::virtual_hook(QIconEngine *this,int id,void *data)

{
  undefined1 auVar1 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> QVar2;
  uint uVar3;
  ulong uVar4;
  ScaledPixmapArgument *arg;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  ulong local_58;
  QPixmap local_50;
  undefined1 local_38 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (id == 4) {
    dVar7 = *(double *)((long)data + 0x10) * (double)(int)*data;
    dVar8 = *(double *)((long)data + 0x10) * (double)(int)((ulong)*data >> 0x20);
    dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
    dVar8 = (double)((ulong)dVar8 & 0x8000000000000000 | 0x3fe0000000000000) + dVar8;
    auVar1._4_4_ = -(uint)(-2147483648.0 < dVar7);
    auVar1._0_4_ = -(uint)(-2147483648.0 < dVar8);
    auVar1._8_4_ = -(uint)(2147483647.0 < dVar8);
    auVar1._12_4_ = -(uint)(2147483647.0 < dVar7);
    uVar3 = movmskps((int)local_20,auVar1);
    uVar5 = 0x80000000;
    if ((uVar3 & 2) != 0) {
      uVar5 = (ulong)(uint)(int)dVar7;
    }
    uVar6 = 0x8000000000000000;
    if ((uVar3 & 1) != 0) {
      uVar6 = (ulong)(uint)(int)dVar8 << 0x20;
    }
    uVar4 = 0x7fffffff00000000;
    if ((uVar3 & 4) == 0) {
      uVar4 = uVar6;
    }
    local_58 = 0x7fffffff;
    if ((uVar3 & 8) == 0) {
      local_58 = uVar5;
    }
    local_58 = local_58 | uVar4;
    (*this->_vptr_QIconEngine[4])
              (&local_50,this,&local_58,(ulong)*(uint *)((long)data + 8),
               (ulong)*(uint *)((long)data + 0xc));
    local_28.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_38);
    QVar2.d.ptr = local_50.data.d.ptr;
    local_38._0_8_ = &PTR__QPixmap_007d25a8;
    local_50.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
    local_28.d.ptr = *(totally_ordered_wrapper<QPlatformPixmap_*> *)((long)data + 0x28);
    ((totally_ordered_wrapper<QPlatformPixmap_*> *)((long)data + 0x28))->ptr =
         (QPlatformPixmap *)QVar2.d.ptr;
    QPixmap::~QPixmap((QPixmap *)local_38);
    QPixmap::~QPixmap(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconEngine::virtual_hook(int id, void *data)
{
    switch (id) {
    case QIconEngine::ScaledPixmapHook: {
        QIconEngine::ScaledPixmapArgument &arg =
            *reinterpret_cast<QIconEngine::ScaledPixmapArgument*>(data);
        // try to get a pixmap with the correct size, the dpr is adjusted later on
        arg.pixmap = pixmap(arg.size * arg.scale, arg.mode, arg.state);
        break;
    }
    default:
        break;
    }
}